

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<signed_char,signed_char,signed_char,duckdb::BinaryLambdaWrapper,bool,signed_char(*)(signed_char,signed_char),true,false>
               (char *ldata,char *rdata,char *result_data,idx_t count,ValidityMask *mask,
               _func_char_char_char *fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  char cVar3;
  char cVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  idx_t iVar10;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar10 = 0;
      cVar4 = *ldata;
      do {
        cVar3 = (*fun)(cVar4,rdata[iVar10]);
        result_data[iVar10] = cVar3;
        iVar10 = iVar10 + 1;
      } while (count != iVar10);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar5 = 0;
    uVar9 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar7 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar7 = count;
        }
LAB_002cc165:
        uVar8 = uVar9;
        if (uVar9 < uVar7) {
          cVar4 = *ldata;
          do {
            cVar3 = (*fun)(cVar4,rdata[uVar9]);
            result_data[uVar9] = cVar3;
            uVar9 = uVar9 + 1;
            uVar8 = uVar7;
          } while (uVar7 != uVar9);
        }
      }
      else {
        uVar2 = puVar1[uVar5];
        uVar7 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar7 = count;
        }
        uVar8 = uVar7;
        if (uVar2 != 0) {
          if (uVar2 == 0xffffffffffffffff) goto LAB_002cc165;
          uVar8 = uVar9;
          if (uVar9 < uVar7) {
            uVar6 = 0;
            do {
              if ((uVar2 >> (uVar6 & 0x3f) & 1) != 0) {
                cVar4 = (*fun)(*ldata,rdata[uVar6 + uVar9]);
                result_data[uVar6 + uVar9] = cVar4;
              }
              uVar6 = uVar6 + 1;
              uVar8 = uVar7;
            } while (uVar7 - uVar9 != uVar6);
          }
        }
      }
      uVar5 = uVar5 + 1;
      uVar9 = uVar8;
    } while (uVar5 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}